

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O1

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
::fillFab_Cpu(GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
              *this,BaseFab<double> *levelset,Geometry *geom,Box *bounding_box)

{
  Box *pBVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  GpuArray<double,_3U> local_f8;
  Dim3 local_d8;
  Dim3 local_c8;
  GpuArray<double,_3U> local_b8;
  anon_class_48_6_13979bf4 local_a0;
  Array4<double> local_70;
  
  local_a0.problo = &local_f8;
  local_f8.arr[0] = (geom->prob_domain).xlo[0];
  local_f8.arr[1] = (geom->prob_domain).xlo[1];
  local_f8.arr[2] = (geom->prob_domain).xlo[2];
  local_b8.arr[0] = (geom->super_CoordSys).dx[0];
  local_b8.arr[1] = (geom->super_CoordSys).dx[1];
  local_a0.dx = &local_b8;
  local_b8.arr[2] = (geom->super_CoordSys).dx[2];
  local_c8.z = (bounding_box->smallend).vect[2];
  local_c8.x = (bounding_box->smallend).vect[0];
  local_c8.y = (bounding_box->smallend).vect[1];
  local_a0.blo = &local_c8;
  local_d8.z = (bounding_box->bigend).vect[2];
  local_d8.x = (bounding_box->bigend).vect[0];
  local_d8.y = (bounding_box->bigend).vect[1];
  local_a0.bhi = &local_d8;
  local_70.p = levelset->dptr;
  local_70.ncomp = levelset->nvar;
  pBVar1 = &levelset->domain;
  local_70.begin.z = (levelset->domain).smallend.vect[2];
  local_70.begin.x = (pBVar1->smallend).vect[0];
  local_70.begin.y = (pBVar1->smallend).vect[1];
  lVar4 = (long)(levelset->domain).bigend.vect[0];
  lVar3 = (long)(levelset->domain).bigend.vect[1] + 1;
  local_a0.a = &local_70;
  local_70.jstride = (lVar4 - (pBVar1->smallend).vect[0]) + 1;
  local_70.kstride = (lVar3 - (levelset->domain).smallend.vect[1]) * local_70.jstride;
  lVar2 = (long)(levelset->domain).bigend.vect[2] + 1;
  local_70.nstride = (lVar2 - local_70.begin.z) * local_70.kstride;
  local_70.end._0_8_ = lVar4 + 1U & 0xffffffff | lVar3 << 0x20;
  local_70.end.z = (int)lVar2;
  local_a0.this = this;
  LoopOnCpu<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>::fillFab_Cpu(amrex::BaseFab<double>&,amrex::Geometry_const&,amrex::Box_const&)const::_lambda(int,int,int)_1_>
            (&levelset->domain,&local_a0);
  return;
}

Assistant:

void fillFab_Cpu (BaseFab<Real>& levelset, const Geometry& geom,
                      Box const& bounding_box) const noexcept
    {
        const auto problo = geom.ProbLoArray();
        const auto dx = geom.CellSizeArray();
        const Box& bx = levelset.box();
        const auto blo = amrex::lbound(bounding_box);
        const auto bhi = amrex::ubound(bounding_box);

        const auto& a = levelset.array();
        amrex::LoopOnCpu(bx, [&] (int i, int j, int k) noexcept
        {
            a(i,j,k) = m_f(RealArray{AMREX_D_DECL(problo[0]+amrex::Clamp(i,blo.x,bhi.x)*dx[0],
                                                  problo[1]+amrex::Clamp(j,blo.y,bhi.y)*dx[1],
                                                  problo[2]+amrex::Clamp(k,blo.z,bhi.z)*dx[2])});
        });
    }